

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

int QUtil::str_compare_nocase(char *s1,char *s2)

{
  int iVar1;
  
  iVar1 = strcasecmp(s1,s2);
  return iVar1;
}

Assistant:

int
QUtil::str_compare_nocase(char const* s1, char const* s2)
{
#if defined(_WIN32) && defined(__BORLANDC__)
    return stricmp(s1, s2);
#elif defined(_WIN32)
    return _stricmp(s1, s2);
#else
    return strcasecmp(s1, s2);
#endif
}